

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O3

bool __thiscall BamTools::BamAlignment::BuildCharData(BamAlignment *this)

{
  string *psVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *__s;
  pointer pCVar6;
  pointer pcVar7;
  int iVar8;
  long *plVar9;
  char cVar10;
  size_type *psVar11;
  uint uVar12;
  pointer pCVar13;
  uint uVar14;
  ulong uVar15;
  string message;
  string local_80;
  uint32_t local_60;
  uint local_5c;
  ulong local_58;
  string local_50;
  
  if ((this->SupportData).HasCoreOnly == true) {
    uVar12 = (this->SupportData).NumCigarOperations * 4 + (this->SupportData).QueryNameLength;
    local_60 = (this->SupportData).BlockLength;
    uVar4 = (this->SupportData).QuerySequenceLength;
    uVar14 = (uVar4 + 1 >> 1) + uVar12;
    local_58 = (ulong)(uVar4 + uVar14);
    pcVar5 = (char *)(this->Name)._M_string_length;
    __s = (this->SupportData).AllCharData._M_dataplus._M_p;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)this,0,pcVar5,(ulong)__s);
    psVar1 = &this->QueryBases;
    (this->QueryBases)._M_string_length = 0;
    *(this->QueryBases)._M_dataplus._M_p = '\0';
    local_5c = uVar14;
    if ((uVar12 < uVar14) &&
       (std::__cxx11::string::reserve((ulong)psVar1), (this->SupportData).QuerySequenceLength != 0))
    {
      uVar15 = 0;
      do {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)psVar1,(this->QueryBases)._M_string_length,0,'\x01');
        uVar15 = uVar15 + 1;
      } while (uVar15 < (this->SupportData).QuerySequenceLength);
    }
    (this->Qualities)._M_string_length = 0;
    *(this->Qualities)._M_dataplus._M_p = '\0';
    if (local_5c < (uint)local_58) {
      psVar2 = &this->Qualities;
      if ((this->SupportData).AllCharData._M_dataplus._M_p[local_5c] == -1) {
        std::__cxx11::string::resize((ulong)psVar2,(char)(this->SupportData).QuerySequenceLength);
      }
      else {
        std::__cxx11::string::reserve((ulong)psVar2);
        if ((this->SupportData).QuerySequenceLength != 0) {
          uVar15 = 0;
          do {
            std::__cxx11::string::_M_replace_aux
                      ((ulong)psVar2,(this->Qualities)._M_string_length,0,'\x01');
            uVar15 = uVar15 + 1;
          } while (uVar15 < (this->SupportData).QuerySequenceLength);
        }
      }
    }
    (this->AlignedBases)._M_string_length = 0;
    *(this->AlignedBases)._M_dataplus._M_p = '\0';
    if (((this->QueryBases)._M_string_length != 0) &&
       (iVar8 = std::__cxx11::string::compare((char *)psVar1), iVar8 != 0)) {
      psVar2 = &this->AlignedBases;
      std::__cxx11::string::reserve((ulong)psVar2);
      pCVar13 = (this->CigarData).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar6 = (this->CigarData).
               super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar13 != pCVar6) {
LAB_00182dcf:
        cVar10 = pCVar13->Type;
        switch(cVar10) {
        case 'H':
          goto switchD_00182dea_caseD_48;
        case 'J':
        case 'K':
        case 'L':
        case 'O':
        case 'Q':
        case 'R':
        case 'T':
        case 'U':
        case 'V':
        case 'W':
switchD_00182dea_caseD_4a:
          paVar3 = &local_50.field_2;
          local_50._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"invalid CIGAR operation type: ","");
          plVar9 = (long *)std::__cxx11::string::_M_replace_aux
                                     ((ulong)&local_50,local_50._M_string_length,0,'\x01');
          psVar11 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_80.field_2._M_allocated_capacity = *psVar11;
            local_80.field_2._8_8_ = plVar9[3];
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          }
          else {
            local_80.field_2._M_allocated_capacity = *psVar11;
            local_80._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_80._M_string_length = plVar9[1];
          *plVar9 = (long)psVar11;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar3) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          local_50._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"BamAlignment::BuildCharData","");
          SetErrorString(this,&local_50,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != paVar3) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          return false;
        case 'N':
          cVar10 = (char)pCVar13->Length;
          uVar15 = (this->AlignedBases)._M_string_length;
          break;
        case 'P':
          cVar10 = (char)pCVar13->Length;
          uVar15 = (this->AlignedBases)._M_string_length;
          break;
        case 'S':
          goto switchD_00182dea_caseD_53;
        default:
          if (cVar10 == 'D') {
            cVar10 = (char)pCVar13->Length;
            uVar15 = (this->AlignedBases)._M_string_length;
            break;
          }
          if (cVar10 != '=') goto switchD_00182dea_caseD_4a;
        case 'I':
        case 'M':
        case 'X':
          std::__cxx11::string::substr((ulong)&local_80,(ulong)psVar1);
          std::__cxx11::string::_M_append((char *)psVar2,(ulong)local_80._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
          goto switchD_00182dea_caseD_53;
        }
        std::__cxx11::string::_M_replace_aux((ulong)psVar2,uVar15,0,cVar10);
        goto switchD_00182dea_caseD_48;
      }
    }
LAB_00182e8e:
    (this->TagData)._M_string_length = 0;
    *(this->TagData)._M_dataplus._M_p = '\0';
    if ((uint)local_58 < local_60 - 0x20) {
      uVar12 = (local_60 - 0x20) - (uint)local_58;
      uVar15 = local_58 & 0xffffffff;
      pcVar7 = (this->SupportData).AllCharData._M_dataplus._M_p;
      std::__cxx11::string::resize((ulong)&this->TagData,(char)uVar12);
      memcpy((this->TagData)._M_dataplus._M_p,pcVar7 + uVar15,(ulong)uVar12);
    }
    (this->SupportData).HasCoreOnly = false;
  }
  return true;
switchD_00182dea_caseD_53:
switchD_00182dea_caseD_48:
  pCVar13 = pCVar13 + 1;
  if (pCVar13 == pCVar6) goto LAB_00182e8e;
  goto LAB_00182dcf;
}

Assistant:

bool BamAlignment::BuildCharData()
{

    // skip if char data already parsed
    if (!SupportData.HasCoreOnly) return true;

    // check system endianness
    bool IsBigEndian = BamTools::SystemIsBigEndian();

    // calculate character lengths/offsets
    const unsigned int dataLength = SupportData.BlockLength - Constants::BAM_CORE_SIZE;
    const unsigned int seqDataOffset =
        SupportData.QueryNameLength + (SupportData.NumCigarOperations * 4);
    const unsigned int qualDataOffset = seqDataOffset + (SupportData.QuerySequenceLength + 1) / 2;
    const unsigned int tagDataOffset = qualDataOffset + SupportData.QuerySequenceLength;
    const unsigned int tagDataLength = dataLength - tagDataOffset;

    // check offsets to see what char data exists
    const bool hasSeqData = (seqDataOffset < qualDataOffset);
    const bool hasQualData = (qualDataOffset < tagDataOffset);
    const bool hasTagData = (tagDataOffset < dataLength);

    // store alignment name (relies on null char in name as terminator)
    Name.assign(SupportData.AllCharData.data());

    // save query sequence
    QueryBases.clear();
    if (hasSeqData) {
        const char* seqData = SupportData.AllCharData.data() + seqDataOffset;
        QueryBases.reserve(SupportData.QuerySequenceLength);
        for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i) {
            const char singleBase =
                Constants::BAM_DNA_LOOKUP[((seqData[(i / 2)] >> (4 * (1 - (i % 2)))) & 0xf)];
            QueryBases.append(1, singleBase);
        }
    }

    // save qualities

    Qualities.clear();
    if (hasQualData) {
        const char* qualData = SupportData.AllCharData.data() + qualDataOffset;

        // if marked as unstored (sequence of 0xFF) - don't do conversion, just fill with 0xFFs
        if (qualData[0] == (char)0xFF)
            Qualities.resize(SupportData.QuerySequenceLength, (char)0xFF);

        // otherwise convert from numeric QV to 'FASTQ-style' ASCII character
        else {
            Qualities.reserve(SupportData.QuerySequenceLength);
            for (std::size_t i = 0; i < SupportData.QuerySequenceLength; ++i)
                Qualities.append(1, qualData[i] + 33);
        }
    }

    // clear previous AlignedBases
    AlignedBases.clear();

    // if QueryBases has data, build AlignedBases using CIGAR data
    // otherwise, AlignedBases will remain empty (this case IS allowed)
    if (!QueryBases.empty() && QueryBases != "*") {

        // resize AlignedBases
        AlignedBases.reserve(SupportData.QuerySequenceLength);

        // iterate over CigarOps
        int k = 0;
        std::vector<CigarOp>::const_iterator cigarIter = CigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = CigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);

            switch (op.Type) {

                // for 'M', 'I', '=', 'X' - write bases
                case (Constants::BAM_CIGAR_MATCH_CHAR):
                case (Constants::BAM_CIGAR_INS_CHAR):
                case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                    AlignedBases.append(QueryBases.substr(k, op.Length));
                    // fall through

                // for 'S' - soft clip, do not write bases
                // but increment placeholder 'k'
                case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                    k += op.Length;
                    break;

                // for 'D' - write gap character
                case (Constants::BAM_CIGAR_DEL_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_DEL);
                    break;

                // for 'P' - write padding character
                case (Constants::BAM_CIGAR_PAD_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_PAD);
                    break;

                // for 'N' - write N's, skip bases in original query sequence
                case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                    AlignedBases.append(op.Length, Constants::BAM_DNA_N);
                    break;

                // for 'H' - hard clip, do nothing to AlignedBases, move to next op
                case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                    break;

                // invalid CIGAR op-code
                default:
                    const std::string message =
                        std::string("invalid CIGAR operation type: ") + op.Type;
                    SetErrorString("BamAlignment::BuildCharData", message);
                    return false;
            }
        }
    }

    // save tag data
    TagData.clear();
    if (hasTagData) {

        char* tagData = (((char*)SupportData.AllCharData.data()) + tagDataOffset);

        if (IsBigEndian) {
            std::size_t i = 0;
            while (i < tagDataLength) {

                i += Constants::BAM_TAG_TAGSIZE;  // skip tag chars (e.g. "RG", "NM", etc.)
                const char type = tagData[i];     // get tag type at position i
                ++i;                              // move i past tag type

                switch (type) {

                    case (Constants::BAM_TAG_TYPE_ASCII):
                    case (Constants::BAM_TAG_TYPE_INT8):
                    case (Constants::BAM_TAG_TYPE_UINT8):
                        // no endian swapping necessary for single-byte data
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_INT16):
                    case (Constants::BAM_TAG_TYPE_UINT16):
                        BamTools::SwapEndian_16p(&tagData[i]);
                        i += sizeof(uint16_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_FLOAT):
                    case (Constants::BAM_TAG_TYPE_INT32):
                    case (Constants::BAM_TAG_TYPE_UINT32):
                        BamTools::SwapEndian_32p(&tagData[i]);
                        i += sizeof(uint32_t);
                        break;

                    case (Constants::BAM_TAG_TYPE_HEX):
                    case (Constants::BAM_TAG_TYPE_STRING):
                        // no endian swapping necessary for hex-string/string data
                        while (tagData[i])
                            ++i;
                        // increment one more for null terminator
                        ++i;
                        break;

                    case (Constants::BAM_TAG_TYPE_ARRAY):

                    {
                        // read array type
                        const char arrayType = tagData[i];
                        ++i;

                        // swap endian-ness of number of elements in place, then retrieve for loop
                        BamTools::SwapEndian_32p(&tagData[i]);
                        uint32_t numElements;
                        memcpy(&numElements, &tagData[i], sizeof(uint32_t));
                        i += sizeof(uint32_t);

                        // swap endian-ness of array elements
                        for (std::size_t j = 0; j < numElements; ++j) {
                            switch (arrayType) {
                                case (Constants::BAM_TAG_TYPE_INT8):
                                case (Constants::BAM_TAG_TYPE_UINT8):
                                    // no endian-swapping necessary
                                    ++i;
                                    break;
                                case (Constants::BAM_TAG_TYPE_INT16):
                                case (Constants::BAM_TAG_TYPE_UINT16):
                                    BamTools::SwapEndian_16p(&tagData[i]);
                                    i += sizeof(uint16_t);
                                    break;
                                case (Constants::BAM_TAG_TYPE_FLOAT):
                                case (Constants::BAM_TAG_TYPE_INT32):
                                case (Constants::BAM_TAG_TYPE_UINT32):
                                    BamTools::SwapEndian_32p(&tagData[i]);
                                    i += sizeof(uint32_t);
                                    break;
                                default:
                                    const std::string message =
                                        std::string("invalid binary array type: ") + arrayType;
                                    SetErrorString("BamAlignment::BuildCharData", message);
                                    return false;
                            }
                        }

                        break;
                    }

                    // invalid tag type-code
                    default:
                        const std::string message = std::string("invalid tag type: ") + type;
                        SetErrorString("BamAlignment::BuildCharData", message);
                        return false;
                }
            }
        }

        // store tagData in alignment
        TagData.resize(tagDataLength);
        memcpy((char*)(TagData.data()), tagData, tagDataLength);
    }

    // clear core-only flag & return success
    SupportData.HasCoreOnly = false;
    return true;
}